

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O1

uint zvgDmaSendSwap(void)

{
  uchar *puVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = zvgDmaStart(ZvgIO.dmaCurP,ZvgIO.dmaCurCount);
  puVar1 = ZvgIO.dmaBf1P;
  if ((uVar2 == 0) &&
     (*(uint *)(ZvgIO.mBfr + (ulong)(ZvgIO.dmaCurP != ZvgIO.dmaBf1P) * 0x10 + -0x24) =
           ZvgIO.dmaCurCount, bVar3 = ZvgIO.dmaCurP == puVar1, ZvgIO.dmaCurP = puVar1, bVar3)) {
    ZvgIO.dmaCurP = ZvgIO.dmaBf2P;
  }
  ZvgIO.dmaCurCount = 0;
  return uVar2;
}

Assistant:

uint zvgDmaSendSwap( void)
{
	uint	err;

	err = zvgDmaStart( ZvgIO.dmaCurP, ZvgIO.dmaCurCount);

	if (!err)
	{
		if (ZvgIO.dmaCurP == ZvgIO.dmaBf1P)
		{	ZvgIO.dmaBf1Count = ZvgIO.dmaCurCount;			// keep track of count for possible resend
			ZvgIO.dmaCurP = ZvgIO.dmaBf2P;					// point to 2nd buffer
		}
		else
		{	ZvgIO.dmaBf2Count = ZvgIO.dmaCurCount;			// keep track of count for possible resend
			ZvgIO.dmaCurP = ZvgIO.dmaBf1P;					// point to 1st buffer
		}
		ZvgIO.dmaCurCount = 0;								// clear buffer
	}

	ZvgIO.dmaCurCount = 0;
	return (err);
}